

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bswap.c
# Opt level: O2

void mpt_bswap_80(long len,mpt_float80 *val)

{
  long lVar1;
  long lVar2;
  mpt_float80 *pmVar3;
  uint8_t uStack_b;
  uint8_t tmp [10];
  
  lVar1 = 0;
  if (len < 1) {
    len = lVar1;
  }
  for (; lVar1 != len; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
      tmp[lVar2] = val->_mantissa[lVar2];
    }
    pmVar3 = val;
    lVar2 = 10;
    while (lVar2 != 0) {
      pmVar3->_mantissa[0] = tmp[lVar2 + -1];
      pmVar3 = (mpt_float80 *)(pmVar3->_mantissa + 1);
      lVar2 = lVar2 + -1;
    }
    val = val + 1;
  }
  return;
}

Assistant:

extern void mpt_bswap_80(long len, MPT_STRUCT(float80) *val)
{
	long i;
	for (i = 0; i < len; ++i) {
		uint8_t tmp[sizeof(*val)], *ptr = (uint8_t *) val++;
		unsigned pos;
		for (pos = 0; pos < sizeof(tmp); pos++) {
			tmp[pos] = ptr[pos];
		}
		for (pos = 0; pos < sizeof(tmp); pos++) {
			ptr[pos] = tmp[sizeof(tmp) - 1 - pos];
		}
	}
}